

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldConvertorsTestCase.cpp
# Opt level: O0

void __thiscall
SuiteFieldConvertorsTests::TestutcTimeStampConvertFromSecond::RunImpl
          (TestutcTimeStampConvertFromSecond *this)

{
  TestResults *pTVar1;
  TestResults **ppTVar2;
  TestDetails **ppTVar3;
  TestDetails local_470;
  int local_450 [10];
  TestDetails local_428;
  int local_408 [10];
  TestDetails local_3e0;
  int local_3c0 [10];
  TestDetails local_398;
  int local_378 [10];
  TestDetails local_350;
  int local_330 [10];
  TestDetails local_308;
  int local_2e8 [10];
  TestDetails local_2c0;
  int local_29c [2];
  allocator<char> local_291;
  string local_290;
  undefined1 local_270 [8];
  UtcTimeStamp result2;
  TestDetails local_238;
  int local_218 [10];
  TestDetails local_1f0;
  int local_1d0 [10];
  TestDetails local_1a8;
  int local_188 [10];
  TestDetails local_160;
  int local_140 [10];
  TestDetails local_118;
  int local_f8 [10];
  TestDetails local_d0;
  int local_b0 [10];
  TestDetails local_88;
  int local_64 [6];
  allocator<char> local_49;
  string local_48;
  undefined1 local_28 [8];
  UtcTimeStamp result;
  TestutcTimeStampConvertFromSecond *this_local;
  
  result.super_DateTime.m_time = (int64_t)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"20000426-12:05:06",&local_49);
  FIX::UtcTimeStampConvertor::convert((UtcTimeStamp *)local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_64[1] = 0xc;
  local_64[0] = FIX::DateTime::getHour((DateTime *)local_28);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_88,*ppTVar3,0x11f);
  UnitTest::CheckEqual<int,int>(pTVar1,local_64 + 1,local_64,&local_88);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_b0[1] = 5;
  local_b0[0] = FIX::DateTime::getMinute((DateTime *)local_28);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_d0,*ppTVar3,0x120);
  UnitTest::CheckEqual<int,int>(pTVar1,local_b0 + 1,local_b0,&local_d0);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_f8[1] = 6;
  local_f8[0] = FIX::DateTime::getSecond((DateTime *)local_28);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_118,*ppTVar3,0x121);
  UnitTest::CheckEqual<int,int>(pTVar1,local_f8 + 1,local_f8,&local_118);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_140[1] = 0;
  local_140[0] = FIX::DateTime::getFraction((DateTime *)local_28,0);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_160,*ppTVar3,0x122);
  UnitTest::CheckEqual<int,int>(pTVar1,local_140 + 1,local_140,&local_160);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_188[1] = 2000;
  local_188[0] = FIX::DateTime::getYear((DateTime *)local_28);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_1a8,*ppTVar3,0x123);
  UnitTest::CheckEqual<int,int>(pTVar1,local_188 + 1,local_188,&local_1a8);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_1d0[1] = 4;
  local_1d0[0] = FIX::DateTime::getMonth((DateTime *)local_28);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_1f0,*ppTVar3,0x124);
  UnitTest::CheckEqual<int,int>(pTVar1,local_1d0 + 1,local_1d0,&local_1f0);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_218[1] = 0x1a;
  local_218[0] = FIX::DateTime::getDate((DateTime *)local_28);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_238,*ppTVar3,0x125);
  UnitTest::CheckEqual<int,int>(pTVar1,local_218 + 1,local_218,&local_238);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_290,"20000426-12:05:06",&local_291);
  FIX::UtcTimeStampConvertor::convert((UtcTimeStamp *)local_270,&local_290);
  std::__cxx11::string::~string((string *)&local_290);
  std::allocator<char>::~allocator(&local_291);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_29c[1] = 0xc;
  local_29c[0] = FIX::DateTime::getHour((DateTime *)local_270);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_2c0,*ppTVar3,0x129);
  UnitTest::CheckEqual<int,int>(pTVar1,local_29c + 1,local_29c,&local_2c0);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_2e8[1] = 5;
  local_2e8[0] = FIX::DateTime::getMinute((DateTime *)local_270);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_308,*ppTVar3,0x12a);
  UnitTest::CheckEqual<int,int>(pTVar1,local_2e8 + 1,local_2e8,&local_308);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_330[1] = 6;
  local_330[0] = FIX::DateTime::getSecond((DateTime *)local_270);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_350,*ppTVar3,299);
  UnitTest::CheckEqual<int,int>(pTVar1,local_330 + 1,local_330,&local_350);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_378[1] = 0;
  local_378[0] = FIX::DateTime::getFraction((DateTime *)local_270,0);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_398,*ppTVar3,300);
  UnitTest::CheckEqual<int,int>(pTVar1,local_378 + 1,local_378,&local_398);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_3c0[1] = 2000;
  local_3c0[0] = FIX::DateTime::getYear((DateTime *)local_270);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_3e0,*ppTVar3,0x12d);
  UnitTest::CheckEqual<int,int>(pTVar1,local_3c0 + 1,local_3c0,&local_3e0);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_408[1] = 4;
  local_408[0] = FIX::DateTime::getMonth((DateTime *)local_270);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_428,*ppTVar3,0x12e);
  UnitTest::CheckEqual<int,int>(pTVar1,local_408 + 1,local_408,&local_428);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_450[1] = 0x1a;
  local_450[0] = FIX::DateTime::getDate((DateTime *)local_270);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_470,*ppTVar3,0x12f);
  UnitTest::CheckEqual<int,int>(pTVar1,local_450 + 1,local_450,&local_470);
  FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)local_270);
  FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)local_28);
  return;
}

Assistant:

TEST(utcTimeStampConvertFromSecond)
{
  UtcTimeStamp result = UtcTimeStampConvertor::convert
    ( std::string( "20000426-12:05:06" ) );
  CHECK_EQUAL( 12, result.getHour() );
  CHECK_EQUAL( 5, result.getMinute() );
  CHECK_EQUAL( 6, result.getSecond() );
  CHECK_EQUAL( 0, result.getFraction(0) );
  CHECK_EQUAL( 2000, result.getYear() );
  CHECK_EQUAL( 4, result.getMonth() );
  CHECK_EQUAL( 26, result.getDate() );

  UtcTimeStamp result2 = UtcTimeStampConvertor::convert
    ( std::string( "20000426-12:05:06" ) );
  CHECK_EQUAL( 12, result2.getHour() );
  CHECK_EQUAL( 5, result2.getMinute() );
  CHECK_EQUAL( 6, result2.getSecond() );
  CHECK_EQUAL( 0, result2.getFraction(0) );
  CHECK_EQUAL( 2000, result2.getYear() );
  CHECK_EQUAL( 4, result2.getMonth() );
  CHECK_EQUAL( 26, result2.getDate() );
}